

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G2.c
# Opt level: O1

void copy_conditional(unsigned_long *dst,unsigned_long *src,unsigned_long move)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = -move;
  uVar2 = move - 1;
  *dst = *dst & uVar2 ^ *src & uVar1;
  dst[1] = dst[1] & uVar2 ^ src[1] & uVar1;
  dst[2] = dst[2] & uVar2 ^ src[2] & uVar1;
  dst[3] = uVar2 & dst[3] ^ uVar1 & src[3];
  return;
}

Assistant:

static void copy_conditional(BN_ULONG dst[2*N_LIMBS],
                             const BN_ULONG src[2*N_LIMBS], BN_ULONG move)
{
    BN_ULONG mask1 = 0-move;
    BN_ULONG mask2 = ~mask1;

    dst[0] = (src[0] & mask1) ^ (dst[0] & mask2);
    dst[1] = (src[1] & mask1) ^ (dst[1] & mask2);
    dst[2] = (src[2] & mask1) ^ (dst[2] & mask2);
    dst[3] = (src[3] & mask1) ^ (dst[3] & mask2);
    dst[4] = (src[4] & mask1) ^ (dst[4] & mask2);
    dst[5] = (src[5] & mask1) ^ (dst[5] & mask2);
    dst[6] = (src[6] & mask1) ^ (dst[6] & mask2);
    dst[7] = (src[7] & mask1) ^ (dst[7] & mask2);
    if (N_LIMBS == 8) {
        dst[ 8] = (src[ 8] & mask1) ^ (dst[ 8] & mask2);
        dst[ 9] = (src[ 9] & mask1) ^ (dst[ 9] & mask2);
        dst[10] = (src[10] & mask1) ^ (dst[10] & mask2);
        dst[11] = (src[11] & mask1) ^ (dst[11] & mask2);
        dst[12] = (src[12] & mask1) ^ (dst[12] & mask2);
        dst[13] = (src[13] & mask1) ^ (dst[13] & mask2);
        dst[14] = (src[14] & mask1) ^ (dst[14] & mask2);
        dst[15] = (src[15] & mask1) ^ (dst[15] & mask2);
    }
}